

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symmetric_matrix.cc
# Opt level: O1

bool __thiscall sptk::SymmetricMatrix::Invert(SymmetricMatrix *this,SymmetricMatrix *inverse_matrix)

{
  int iVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  bool bVar5;
  undefined1 uVar6;
  undefined7 extraout_var;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  size_type __n;
  long lVar11;
  pointer ppdVar12;
  pointer ppdVar13;
  size_type sVar14;
  size_type sVar15;
  long lVar16;
  size_type sVar17;
  long lVar18;
  double sum;
  double dVar19;
  vector<double,_std::allocator<double>_> inverse_diagonal_elements;
  vector<double,_std::allocator<double>_> diagonal_elements;
  SymmetricMatrix lower_triangular_matrix;
  allocator_type local_ad;
  undefined4 local_ac;
  SymmetricMatrix *local_a8;
  vector<double,_std::allocator<double>_> local_a0;
  vector<double,_std::allocator<double>_> local_88;
  SymmetricMatrix local_70;
  
  if (this == inverse_matrix || inverse_matrix == (SymmetricMatrix *)0x0) {
    uVar6 = 0;
  }
  else {
    if (inverse_matrix->num_dimension_ != this->num_dimension_) {
      Resize(inverse_matrix,this->num_dimension_);
    }
    SymmetricMatrix(&local_70,this->num_dimension_);
    std::vector<double,_std::allocator<double>_>::vector
              (&local_88,(long)this->num_dimension_,(allocator_type *)&local_a0);
    uVar6 = CholeskyDecomposition(this,&local_70,&local_88);
    if ((bool)uVar6) {
      local_ac = (undefined4)CONCAT71(extraout_var,uVar6);
      iVar1 = this->num_dimension_;
      __n = (size_type)iVar1;
      if (0 < (long)__n) {
        ppdVar13 = (inverse_matrix->index_).super__Vector_base<double_*,_std::allocator<double_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        lVar7 = __n * 8;
        ppdVar12 = ppdVar13 + __n;
        sVar14 = __n;
        do {
          sVar15 = sVar14 - 1;
          pdVar2 = ppdVar13[sVar14 - 1];
          pdVar2[sVar14 - 1] = 1.0;
          sVar17 = sVar14;
          if ((long)sVar14 < (long)__n) {
            do {
              pdVar3 = local_70.index_.super__Vector_base<double_*,_std::allocator<double_*>_>.
                       _M_impl.super__Vector_impl_data._M_start[sVar17];
              pdVar4 = ppdVar13[sVar17];
              pdVar4[sVar15] = pdVar3[sVar15] * pdVar2[sVar15];
              if ((long)sVar14 < (long)(int)sVar17) {
                dVar19 = pdVar4[sVar15];
                lVar9 = 0;
                do {
                  dVar19 = dVar19 + *(double *)((long)pdVar3 + lVar9 * 8 + lVar7) *
                                    ppdVar12[lVar9][sVar15];
                  pdVar4[sVar15] = dVar19;
                  lVar9 = lVar9 + 1;
                } while ((int)lVar9 + (int)sVar14 < (int)sVar17);
              }
              pdVar4[sVar15] = -pdVar4[sVar17] * pdVar4[sVar15];
              sVar17 = sVar17 + 1;
            } while ((int)sVar17 < iVar1);
          }
          lVar7 = lVar7 + -8;
          ppdVar12 = ppdVar12 + -1;
          bVar5 = 1 < (long)sVar14;
          sVar14 = sVar15;
        } while (bVar5);
      }
      local_a8 = inverse_matrix;
      std::vector<double,_std::allocator<double>_>::vector(&local_a0,__n,&local_ad);
      iVar1 = this->num_dimension_;
      lVar7 = (long)iVar1;
      if (0 < lVar7) {
        lVar9 = 0;
        do {
          local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar9] =
               1.0 / local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar9];
          lVar9 = lVar9 + 1;
        } while (lVar7 != lVar9);
      }
      if (0 < iVar1) {
        ppdVar12 = (local_a8->index_).super__Vector_base<double_*,_std::allocator<double_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        lVar8 = 1;
        lVar11 = 0;
        lVar16 = 0;
        lVar9 = lVar7;
        ppdVar13 = ppdVar12;
        do {
          pdVar2 = ppdVar12[lVar16];
          lVar18 = 0;
          do {
            dVar19 = 0.0;
            lVar10 = 0;
            do {
              dVar19 = dVar19 + ppdVar13[lVar10][lVar16] *
                                *(double *)
                                 ((long)local_a0.super__Vector_base<double,_std::allocator<double>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                 lVar10 * 8 + lVar11) * ppdVar13[lVar10][lVar18];
              lVar10 = lVar10 + 1;
            } while (lVar9 != lVar10);
            pdVar2[lVar18] = dVar19;
            lVar18 = lVar18 + 1;
          } while (lVar18 != lVar8);
          lVar16 = lVar16 + 1;
          lVar8 = lVar8 + 1;
          ppdVar13 = ppdVar13 + 1;
          lVar11 = lVar11 + 8;
          lVar9 = lVar9 + -1;
        } while (lVar16 != lVar7);
      }
      if (local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      uVar6 = (undefined1)local_ac;
    }
    if (local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    ~SymmetricMatrix(&local_70);
  }
  return (bool)uVar6;
}

Assistant:

bool SymmetricMatrix::Invert(SymmetricMatrix* inverse_matrix) const {
  if (NULL == inverse_matrix || this == inverse_matrix) {
    return false;
  }

  if (inverse_matrix->num_dimension_ != num_dimension_) {
    inverse_matrix->Resize(num_dimension_);
  }

  SymmetricMatrix lower_triangular_matrix(num_dimension_);
  std::vector<double> diagonal_elements(num_dimension_);
  if (!CholeskyDecomposition(&lower_triangular_matrix, &diagonal_elements)) {
    return false;
  }

  for (int i(num_dimension_ - 1); 0 <= i; --i) {
    inverse_matrix->index_[i][i] = 1.0;
    for (int j(i + 1); j < num_dimension_; ++j) {
      inverse_matrix->index_[j][i] =
          lower_triangular_matrix.index_[j][i] * inverse_matrix->index_[i][i];
      for (int k(i + 1); k < j; ++k) {
        inverse_matrix->index_[j][i] +=
            lower_triangular_matrix.index_[j][k] * inverse_matrix->index_[k][i];
      }
      inverse_matrix->index_[j][i] *= -inverse_matrix->index_[j][j];
    }
  }

  std::vector<double> inverse_diagonal_elements(num_dimension_);
  for (int i(0); i < num_dimension_; ++i) {
    inverse_diagonal_elements[i] = 1.0 / diagonal_elements[i];
  }

  for (int i(0); i < num_dimension_; ++i) {
    for (int j(0); j <= i; ++j) {
      double sum(0.0);
      for (int k(i); k < num_dimension_; ++k) {
        sum += inverse_matrix->index_[k][i] * inverse_diagonal_elements[k] *
               inverse_matrix->index_[k][j];
      }
      inverse_matrix->index_[i][j] = sum;
    }
  }

  return true;
}